

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTimeValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DateTimeValidator::setEnumeration(DateTimeValidator *this,MemoryManager *param_1)

{
  RefArrayVectorOf<char16_t> *pRVar1;
  XMLSize_t maxElems;
  int iVar2;
  BaseRefVectorOf<xercesc_4_0::XMLNumber> *pBVar3;
  char16_t *pcVar4;
  undefined4 extraout_var;
  XMLSize_t getAt;
  
  pRVar1 = (this->super_AbstractNumericFacetValidator).fStrEnumeration;
  if (pRVar1 != (RefArrayVectorOf<char16_t> *)0x0) {
    maxElems = (pRVar1->super_BaseRefVectorOf<char16_t>).fCurCount;
    pBVar3 = (BaseRefVectorOf<xercesc_4_0::XMLNumber> *)
             XMemory::operator_new
                       (0x30,(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                             fMemoryManager);
    BaseRefVectorOf<xercesc_4_0::XMLNumber>::BaseRefVectorOf
              (pBVar3,maxElems,true,
               (this->super_AbstractNumericFacetValidator).super_DatatypeValidator.fMemoryManager);
    pBVar3->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00416590;
    (this->super_AbstractNumericFacetValidator).fEnumeration =
         (RefVectorOf<xercesc_4_0::XMLNumber> *)pBVar3;
    (this->super_AbstractNumericFacetValidator).fEnumerationInherited = false;
    if (maxElems != 0) {
      getAt = 0;
      do {
        pBVar3 = &((this->super_AbstractNumericFacetValidator).fEnumeration)->
                  super_BaseRefVectorOf<xercesc_4_0::XMLNumber>;
        pcVar4 = BaseRefVectorOf<char16_t>::elementAt
                           (&((this->super_AbstractNumericFacetValidator).fStrEnumeration)->
                             super_BaseRefVectorOf<char16_t>,getAt);
        iVar2 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                  super_XSerializable._vptr_XSerializable[0x17])
                          (this,pcVar4,
                           (this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                           fMemoryManager);
        BaseRefVectorOf<xercesc_4_0::XMLNumber>::insertElementAt
                  (pBVar3,(XMLNumber *)CONCAT44(extraout_var,iVar2),getAt);
        getAt = getAt + 1;
      } while (maxElems != getAt);
    }
  }
  return;
}

Assistant:

void DateTimeValidator::setEnumeration(MemoryManager* const)
{
// to do: do we need to check against base value space???

    if (!fStrEnumeration)
        return;

    XMLSize_t enumLength = fStrEnumeration->size();
    fEnumeration = new (fMemoryManager) RefVectorOf<XMLNumber>(enumLength, true, fMemoryManager);
    fEnumerationInherited = false;

    for ( XMLSize_t i = 0; i < enumLength; i++)
        fEnumeration->insertElementAt(parse(fStrEnumeration->elementAt(i), fMemoryManager), i);

}